

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_make_type_predicate_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp type)

{
  sexp psVar1;
  
  if ((((ulong)type & 3) == 0) && (type->tag == 1)) {
    type = (sexp)((ulong)(type->value).type.tag * 2 + 1);
  }
  if (((ulong)type & 1) == 0) {
    psVar1 = sexp_type_exception(ctx,self,2,type);
    return psVar1;
  }
  psVar1 = sexp_make_opcode(ctx,self,name,(sexp)&DAT_00000005,(sexp)&DAT_0000005f,
                            (sexp)&DAT_00000003,(sexp)&DAT_00000001,(sexp)&DAT_00000001,
                            (sexp)&DAT_00000001,(sexp)&DAT_00000001,type,(sexp)0x0,(sexp_proc1)0x0);
  return psVar1;
}

Assistant:

sexp sexp_make_type_predicate_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp type) {
  if (sexp_typep(type)) type = sexp_make_fixnum(sexp_type_tag(type));
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, type);
  return sexp_make_opcode(ctx, self, name, sexp_make_fixnum(SEXP_OPC_TYPE_PREDICATE),
                          sexp_make_fixnum(SEXP_OP_TYPEP), SEXP_ONE, SEXP_ZERO,
                          SEXP_ZERO, SEXP_ZERO, SEXP_ZERO, type, NULL, NULL);
}